

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast_node::set_location(ast_node *this,YYLTYPE *locp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  (this->location).path = locp->path;
  (this->location).source = locp->source;
  iVar1 = locp->first_column;
  iVar2 = locp->last_line;
  iVar3 = locp->last_column;
  (this->location).first_line = locp->first_line;
  (this->location).first_column = iVar1;
  (this->location).last_line = iVar2;
  (this->location).last_column = iVar3;
  return;
}

Assistant:

void set_location(const struct YYLTYPE &locp)
   {
      this->location.path = locp.path;
      this->location.source = locp.source;
      this->location.first_line = locp.first_line;
      this->location.first_column = locp.first_column;
      this->location.last_line = locp.last_line;
      this->location.last_column = locp.last_column;
   }